

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O1

void jpc_enc_destroy(jpc_enc_t *enc)

{
  if (enc->curtile != (jpc_enc_tile_t *)0x0) {
    jpc_enc_tile_destroy(enc->curtile);
  }
  if (enc->cp != (jpc_enc_cp_t *)0x0) {
    jpc_enc_cp_destroy(enc->cp);
  }
  if (enc->cstate != (jpc_cstate_t *)0x0) {
    jpc_cstate_destroy(enc->cstate);
  }
  if (enc->tmpstream != (jas_stream_t *)0x0) {
    jas_stream_close(enc->tmpstream);
  }
  jas_free(enc);
  return;
}

Assistant:

void jpc_enc_destroy(jpc_enc_t *enc)
{
	/* The image object (i.e., enc->image) and output stream object
	(i.e., enc->out) are created outside of the encoder.
	Therefore, they must not be destroyed here. */

	if (enc->curtile) {
		jpc_enc_tile_destroy(enc->curtile);
	}
	if (enc->cp) {
		jpc_enc_cp_destroy(enc->cp);
	}
	if (enc->cstate) {
		jpc_cstate_destroy(enc->cstate);
	}
	if (enc->tmpstream) {
		jas_stream_close(enc->tmpstream);
	}

	jas_free(enc);
}